

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

bool __thiscall Diligent::ThreadPoolImpl::ReprioritizeTask(ThreadPoolImpl *this,IAsyncTask *pTask)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator __position;
  bool bVar3;
  float extraout_XMM0_Da;
  float Priority;
  unique_lock<std::mutex> lock;
  float local_4c;
  unique_lock<std::mutex> local_48;
  QueuedTaskInfo local_38;
  
  (*(pTask->super_IObject)._vptr_IObject[9])(pTask);
  local_48._M_device = &this->m_TasksQueueMtx;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  __position._M_node = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      p_Var2 = __position._M_node[1]._M_parent;
      if (p_Var2 == (_Base_ptr)pTask) {
        bVar3 = true;
        if (((float)__position._M_node[1]._M_color != extraout_XMM0_Da) ||
           (NAN((float)__position._M_node[1]._M_color) || NAN(extraout_XMM0_Da))) {
          __position._M_node[1]._M_parent = (_Base_ptr)0x0;
          local_38.Prerequisites.
          super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)__position._M_node[1]._M_left;
          local_38.Prerequisites.
          super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)__position._M_node[1]._M_right;
          local_38.Prerequisites.
          super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(__position._M_node + 2);
          *(undefined8 *)(__position._M_node + 2) = 0;
          __position._M_node[1]._M_left = (_Base_ptr)0x0;
          __position._M_node[1]._M_right = (_Base_ptr)0x0;
          local_38.pTask.m_pObject = (IAsyncTask *)p_Var2;
          std::
          _Rb_tree<float,_std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::_Select1st<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
          ::_M_erase_aux(&(this->m_TasksQueue)._M_t,__position);
          std::
          _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
          ::_M_emplace_equal<float_const&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                    ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                      *)&this->m_TasksQueue,&local_4c,&local_38);
          std::
          vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ::~vector(&local_38.Prerequisites);
          if ((_Base_ptr)local_38.pTask.m_pObject != (_Base_ptr)0x0) {
            (*((local_38.pTask.m_pObject)->super_IObject)._vptr_IObject[2])();
          }
        }
        goto LAB_00518cd1;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  bVar3 = false;
LAB_00518cd1:
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return bVar3;
}

Assistant:

ReprioritizeTask(IAsyncTask* pTask) override final
    {
        const auto Priority = pTask->GetPriority();

        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

        auto it = m_TasksQueue.begin();
        while (it != m_TasksQueue.end() && it->second.pTask != pTask)
            ++it;
        if (it != m_TasksQueue.end())
        {
            if (it->first != Priority)
            {
                auto ExistingTaskInfo = std::move(it->second);
                m_TasksQueue.erase(it);
                m_TasksQueue.emplace(Priority, std::move(ExistingTaskInfo));
            }

            return true;
        }
        return false;
    }